

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacon2.c
# Opt level: O2

int slacon2_(int *n,float *v,float *x,int *isgn,float *est,int *kase,int *isave)

{
  float *pfVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  integer iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  real rVar10;
  float fVar11;
  int c__1;
  float local_48;
  
  c__1 = 1;
  if (*kase == 0) {
    uVar6 = *n;
    uVar8 = 0;
    uVar9 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar9 = uVar8;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      x[uVar8] = 1.0 / (float)(int)uVar6;
    }
    *kase = 1;
    *isave = 1;
    return 0;
  }
  switch(*isave) {
  case 2:
    iVar5 = isamax_(n,x,&c__1);
    iVar4 = iVar5 + -1;
    isave[1] = iVar4;
    isave[2] = 2;
    goto LAB_001161e8;
  case 3:
    scopy_(n,x,&c__1,v,&c__1);
    local_48 = *est;
    rVar10 = sasum_(n,v,&c__1);
    *est = rVar10;
    uVar6 = *n;
    uVar9 = 0;
    uVar8 = 0;
    if (0 < (int)uVar6) {
      uVar8 = (ulong)uVar6;
    }
    do {
      if (uVar8 == uVar9) goto LAB_00116339;
      pfVar1 = x + uVar9;
      piVar2 = isgn + uVar9;
      uVar9 = uVar9 + 1;
    } while ((*(double *)(&DAT_0011b610 + (ulong)(*pfVar1 < 0.0) * 8) == (double)*piVar2) &&
            (!NAN(*(double *)(&DAT_0011b610 + (ulong)(*pfVar1 < 0.0) * 8)) && !NAN((double)*piVar2))
            );
    if (local_48 < rVar10) {
      for (lVar7 = 0; lVar7 < (int)uVar6; lVar7 = lVar7 + 1) {
        fVar11 = x[lVar7];
        x[lVar7] = *(float *)(&DAT_0011b620 + (ulong)(fVar11 < 0.0) * 4);
        isgn[lVar7] = -(uint)(fVar11 < 0.0) | 1;
        uVar6 = *n;
      }
      *kase = 2;
      *isave = 4;
      return 0;
    }
LAB_00116339:
    uVar6 = *n;
    uVar8 = 0;
    uVar9 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar9 = uVar8;
    }
    fVar11 = 1.0;
    iVar4 = 1;
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      x[uVar8] = ((float)(iVar4 + -1) / (float)(int)(uVar6 - 1) + 1.0) * fVar11;
      fVar11 = -fVar11;
      iVar4 = iVar4 + 1;
    }
    *kase = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar3 = isave[1];
    iVar5 = isamax_(n,x,&c__1);
    iVar4 = iVar5 + -1;
    isave[1] = iVar4;
    if (((x[iVar3] == ABS(x[(long)iVar5 + -1])) &&
        (!NAN(x[iVar3]) && !NAN(ABS(x[(long)iVar5 + -1])))) || (4 < isave[2])) goto LAB_00116339;
    isave[2] = isave[2] + 1;
LAB_001161e8:
    uVar8 = 0;
    uVar9 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar9 = uVar8;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      x[uVar8] = 0.0;
    }
    x[iVar4] = 1.0;
    *kase = 1;
    *isave = 3;
    return 0;
  case 5:
    rVar10 = sasum_(n,x,&c__1);
    local_48 = rVar10 / (float)(*n * 3);
    local_48 = local_48 + local_48;
    if (local_48 < *est || local_48 == *est) goto LAB_001163c8;
    scopy_(n,x,&c__1,v,&c__1);
    break;
  default:
    if (*n != 1) {
      rVar10 = sasum_(n,x,&c__1);
      *est = rVar10;
      for (lVar7 = 0; lVar7 < *n; lVar7 = lVar7 + 1) {
        fVar11 = x[lVar7];
        x[lVar7] = *(float *)(&DAT_0011b620 + (ulong)(fVar11 < 0.0) * 4);
        isgn[lVar7] = -(uint)(fVar11 < 0.0) | 1;
      }
      *kase = 2;
      *isave = 2;
      return 0;
    }
    local_48 = *x;
    *v = local_48;
    local_48 = ABS(local_48);
  }
  *est = local_48;
LAB_001163c8:
  *kase = 0;
  return 0;
}

Assistant:

int
slacon2_(int *n, float *v, float *x, int *isgn, float *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    float      zero = 0.0;
    float      one = 1.0;
    
    /* Local variables */
    int jlast;
    float altsgn, estold;
    int i;
    float temp;
#ifdef _CRAY
    extern int ISAMAX(int *, float *, int *);
    extern float SASUM(int *, float *, int *);
    extern int SCOPY(int *, float *, int *, float *, int *);
#else
    extern int isamax_(int *, float *, int *);
    extern float sasum_(int *, float *, int *);
    extern void scopy_(int *, float *, int *, float *, int *);
#endif
#define d_sign(a, b) (b >= 0 ? fabs(a) : -fabs(a))    /* Copy sign */
#define i_dnnt(a) \
	( a>=0 ? floor(a+.5) : -floor(.5-a) ) /* Round to nearest integer */

    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i] = 1. / (float) (*n);
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = fabs(v[0]);
	/*        ... QUIT */
	goto L150;
    }
#ifdef _CRAY
    *est = SASUM(n, x, &c__1);
#else
    *est = sasum_(n, x, &c__1);
#endif

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);  /* j */
#else
    isave[1] = isamax_(n, &x[0], &c__1);  /* j */
#endif
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    SCOPY(n, x, &c__1, v, &c__1);
#else
    scopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
#ifdef _CRAY
    *est = SASUM(n, v, &c__1);
#else
    *est = sasum_(n, v, &c__1);
#endif

    for (i = 0; i < *n; ++i)
	if (i_dnnt(d_sign(one, x[i])) != isgn[i])
	    goto L90;

    /*     REPEATED SIGN VECTOR DETECTED, HENCE ALGORITHM HAS CONVERGED. */
    goto L120;

L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);/* j */
#else
    isave[1] = isamax_(n, &x[0], &c__1);  /* j */
#endif
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast] != fabs(x[isave[1]]) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1] = altsgn * ((float)(i - 1) / (float)(*n - 1) + 1.);
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
#ifdef _CRAY
    temp = SASUM(n, x, &c__1) / (float)(*n * 3) * 2.;
#else
    temp = sasum_(n, x, &c__1) / (float)(*n * 3) * 2.;
#endif
    if (temp > *est) {
#ifdef _CRAY
	SCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	scopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}